

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSep.h
# Opt level: O2

StreamSep * __thiscall
Hpipe::StreamSepMaker::operator<<
          (StreamSep *__return_storage_ptr__,StreamSepMaker *this,char (*val) [68])

{
  if ((this->first_beg)._M_string_length == 0) {
    std::operator<<(this->stream,(string *)&this->beg);
  }
  else {
    std::operator<<(this->stream,(string *)&this->first_beg);
    (this->first_beg)._M_string_length = 0;
    *(this->first_beg)._M_dataplus._M_p = '\0';
  }
  std::operator<<(this->stream,*val);
  StreamSep::StreamSep(__return_storage_ptr__,this->stream,&this->sep,&this->end);
  return __return_storage_ptr__;
}

Assistant:

StreamSep operator<<( const T &val ) {
        if( first_beg.size() ) {
            *stream << first_beg;
            first_beg.clear();
        } else
            *stream << beg;
        *stream << val;
        return StreamSep( stream, sep, end );
    }